

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  long in_RSI;
  int in_EDI;
  string *in_stack_00000670;
  size_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 3) {
    std::operator<<((ostream *)&std::cout,"Please Input the dataset path:");
    std::operator>>((istream *)&std::cin,(string *)FILE_NAME_abi_cxx11_);
    std::operator<<((ostream *)&std::cout,"Please Input the length of record in dtaset:");
    std::istream::operator>>((istream *)&std::cin,&record_length);
  }
  else {
    local_10 = in_RSI;
    std::__cxx11::string::operator=((string *)FILE_NAME_abi_cxx11_,*(char **)(in_RSI + 8));
    pcVar1 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    record_length =
         std::__cxx11::stoi((string *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff68,0);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  printf(
        "\x1b[0m\x1b[1;32m|                                  2. Test on Elastic                                   |\n\x1b[0m"
        );
  printf(
        "\x1b[0m\x1b[1;32m===========================================================================================\n\x1b[0m"
        );
  std::__cxx11::string::string(local_68,(string *)FILE_NAME_abi_cxx11_);
  BenchElastic<4u>(in_stack_00000670);
  std::__cxx11::string::~string(local_68);
  printf(
        "\x1b[0m\x1b[1;32m===========================================================================================\n\x1b[0m"
        );
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc > 2)
	{
		FILE_NAME = argv[1];
		record_length = std::stoi(argv[2]);
	}
	else
	{
		std::cout << "Please Input the dataset path:";
		std::cin >> FILE_NAME;
		std::cout << "Please Input the length of record in dtaset:";
		std::cin >> record_length;
	}
		printf(
			"\033[0m\033[1;32m|                                  2. Test on "
			"Elastic                                   |\n\033[0m");
		printf(
			"\033[0m\033[1;32m======================================================="
			"====================================\n\033[0m");
		BenchElastic<4>(FILE_NAME);
		printf(
			"\033[0m\033[1;32m======================================================="
			"====================================\n\033[0m");
}